

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GetMemberOfVectorOfStruct
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  size_t t;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  Type vectortype;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  vectortype._24_8_ = code_ptr;
  Type::VectorType((Type *)local_50,&(field->value).type);
  GenReceiver(this,struct_def,code_ptr);
  IdlNamer::Function_abi_cxx11_(&local_90,&this->namer_,&field->super_Definition);
  std::operator+(&local_70," ",&local_90);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  TypeName_abi_cxx11_(&local_e0,this,field);
  std::operator+(&local_c0,"(obj *",&local_e0);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  OffsetPrefix_abi_cxx11_(&local_120,this,field);
  std::operator+(&local_100,", j int) bool ",&local_120);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,"\t\tx := rcv._tab.Vector(o)\n");
  std::__cxx11::string::operator+=
            ((string *)vectortype._24_8_,"\t\tx += flatbuffers.UOffsetT(j) * ");
  t = InlineSize((Type *)local_50);
  NumToString<unsigned_long>(&local_160,t);
  std::operator+(&local_140,&local_160,"\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  if ((*(byte *)(vectortype._0_8_ + 0x110) & 1) == 0) {
    std::__cxx11::string::operator+=((string *)vectortype._24_8_,"\t\tx = rcv._tab.Indirect(x)\n");
  }
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,"\t\tobj.Init(rcv._tab.Bytes, x)\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,"\t\treturn true\n\t}\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,"\treturn false\n");
  std::__cxx11::string::operator+=((string *)vectortype._24_8_,"}\n\n");
  return;
}

Assistant:

void GetMemberOfVectorOfStruct(const StructDef &struct_def,
                                 const FieldDef &field, std::string *code_ptr) {
    std::string &code = *code_ptr;
    auto vectortype = field.value.type.VectorType();

    GenReceiver(struct_def, code_ptr);
    code += " " + namer_.Function(field);
    code += "(obj *" + TypeName(field);
    code += ", j int) bool " + OffsetPrefix(field);
    code += "\t\tx := rcv._tab.Vector(o)\n";
    code += "\t\tx += flatbuffers.UOffsetT(j) * ";
    code += NumToString(InlineSize(vectortype)) + "\n";
    if (!(vectortype.struct_def->fixed)) {
      code += "\t\tx = rcv._tab.Indirect(x)\n";
    }
    code += "\t\tobj.Init(rcv._tab.Bytes, x)\n";
    code += "\t\treturn true\n\t}\n";
    code += "\treturn false\n";
    code += "}\n\n";
  }